

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcWallType::~IfcWallType(IfcWallType *this)

{
  ~IfcWallType((IfcWallType *)&this[-1].field_0x48);
  return;
}

Assistant:

IfcWallType() : Object("IfcWallType") {}